

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_WaitForSlotEvent(SoftHSM *this,CK_FLAGS flags,CK_SLOT_ID_PTR param_2,CK_VOID_PTR param_3)

{
  CK_RV CVar1;
  CK_RV CVar2;
  
  CVar2 = 400;
  if ((this->isInitialised & 1U) != 0) {
    CVar2 = 8;
  }
  CVar1 = 0x54;
  if ((flags & 1) != 0) {
    CVar1 = CVar2;
  }
  return CVar1;
}

Assistant:

CK_RV SoftHSM::C_WaitForSlotEvent(CK_FLAGS flags, CK_SLOT_ID_PTR /*pSlot*/, CK_VOID_PTR /*pReserved*/)
{
	if (!(flags & CKF_DONT_BLOCK)) return CKR_FUNCTION_NOT_SUPPORTED;

	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// SoftHSM slots don't change after it's initialised. With the
	// exception of when a slot is initialised and then getSlotList() is
	// called. However, at this point the caller has been updated with the
	// new slot list already so no event needs to be triggered.
	return CKR_NO_EVENT;
}